

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

void __thiscall IZDeflate::build_tree(IZDeflate *this,tree_desc *desc)

{
  ct_data *tree_00;
  ct_data *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uch local_4d;
  int local_4c;
  int local_3c;
  int newv;
  int node;
  int max_code;
  int m;
  int n;
  int elems;
  ct_data *stree;
  ct_data *tree;
  tree_desc *desc_local;
  IZDeflate *this_local;
  
  tree_00 = desc->dyn_tree;
  pcVar1 = desc->static_tree;
  local_3c = desc->elems;
  newv = -1;
  this->heap_len = 0;
  this->heap_max = 0x23d;
  for (max_code = 0; max_code < local_3c; max_code = max_code + 1) {
    if (tree_00[max_code].fc.freq == 0) {
      tree_00[max_code].dl.dad = 0;
    }
    else {
      newv = max_code;
      iVar4 = this->heap_len + 1;
      this->heap_len = iVar4;
      this->heap[iVar4] = max_code;
      this->depth[max_code] = '\0';
    }
  }
  while (this->heap_len < 2) {
    if (newv < 2) {
      local_4c = newv + 1;
      newv = local_4c;
    }
    else {
      local_4c = 0;
    }
    iVar4 = this->heap_len + 1;
    this->heap_len = iVar4;
    this->heap[iVar4] = local_4c;
    tree_00[local_4c].fc.freq = 1;
    this->depth[local_4c] = '\0';
    this->opt_len = this->opt_len - 1;
    if (pcVar1 != (ct_data *)0x0) {
      this->static_len = this->static_len - (ulong)pcVar1[local_4c].dl.dad;
    }
  }
  desc->max_code = newv;
  for (max_code = this->heap_len / 2; 0 < max_code; max_code = max_code + -1) {
    pqdownheap(this,tree_00,max_code);
  }
  do {
    iVar4 = this->heap[1];
    iVar3 = this->heap_len;
    this->heap_len = iVar3 + -1;
    this->heap[1] = this->heap[iVar3];
    pqdownheap(this,tree_00,1);
    iVar3 = this->heap[1];
    iVar2 = this->heap_max + -1;
    this->heap_max = iVar2;
    this->heap[iVar2] = iVar4;
    iVar2 = this->heap_max + -1;
    this->heap_max = iVar2;
    this->heap[iVar2] = iVar3;
    tree_00[local_3c].fc.freq = tree_00[iVar4].fc.freq + tree_00[iVar3].fc.freq;
    if (this->depth[iVar4] < this->depth[iVar3]) {
      local_4d = this->depth[iVar3];
    }
    else {
      local_4d = this->depth[iVar4];
    }
    this->depth[local_3c] = local_4d + '\x01';
    tree_00[iVar3].dl.dad = (ush)local_3c;
    tree_00[iVar4].dl.dad = (ush)local_3c;
    this->heap[1] = local_3c;
    pqdownheap(this,tree_00,1);
    local_3c = local_3c + 1;
  } while (1 < this->heap_len);
  iVar4 = this->heap[1];
  iVar3 = this->heap_max + -1;
  this->heap_max = iVar3;
  this->heap[iVar3] = iVar4;
  gen_bitlen(this,desc);
  gen_codes(this,tree_00,newv);
  return;
}

Assistant:

void IZDeflate::build_tree(tree_desc near *desc)
    // tree_desc near *desc; /* the tree descriptor */
{
    ct_data near *tree   = desc->dyn_tree;
    ct_data near *stree  = desc->static_tree;
    int elems            = desc->elems;
    int n, m;          /* iterate over heap elements */
    int max_code = -1; /* largest code with non zero frequency */
    int node = elems;  /* next internal node of the tree */

    /* Construct the initial heap, with least frequent element in
     * heap[SMALLEST]. The sons of heap[n] are heap[2*n] and heap[2*n+1].
     * heap[0] is not used.
     */
    heap_len = 0, heap_max = HEAP_SIZE;

    for (n = 0; n < elems; n++) {
        if (tree[n].Freq != 0) {
            heap[++heap_len] = max_code = n;
            depth[n] = 0;
        } else {
            tree[n].Len = 0;
        }
    }

    /* The pkzip format requires that at least one distance code exists,
     * and that at least one bit should be sent even if there is only one
     * possible code. So to avoid special checks later on we force at least
     * two codes of non zero frequency.
     */
    while (heap_len < 2) {
        int newv = heap[++heap_len] = (max_code < 2 ? ++max_code : 0);
        tree[newv].Freq = 1;
        depth[newv] = 0;
        opt_len--; if (stree) static_len -= stree[newv].Len;
        /* newv is 0 or 1 so it does not have extra bits */
    }
    desc->max_code = max_code;

    /* The elements heap[heap_len/2+1 .. heap_len] are leaves of the tree,
     * establish sub-heaps of increasing lengths:
     */
    for (n = heap_len/2; n >= 1; n--) pqdownheap(tree, n);

    /* Construct the Huffman tree by repeatedly combining the least two
     * frequent nodes.
     */
    do {
        pqremove(tree, n);   /* n = node of least frequency */
        m = heap[SMALLEST];  /* m = node of next least frequency */

        heap[--heap_max] = n; /* keep the nodes sorted by frequency */
        heap[--heap_max] = m;

        /* Create a new node father of n and m */
        tree[node].Freq = (ush)(tree[n].Freq + tree[m].Freq);
        depth[node] = (uch) (Max(depth[n], depth[m]) + 1);
        tree[n].Dad = tree[m].Dad = (ush)node;
#ifdef DUMP_BL_TREE
        if (tree == bl_tree) {
            fprintf(mesg,"\nnode %d(%d), sons %d(%d) %d(%d)",
                    node, tree[node].Freq, n, tree[n].Freq, m, tree[m].Freq);
        }
#endif
        /* and insert the new node in the heap */
        heap[SMALLEST] = node++;
        pqdownheap(tree, SMALLEST);

    } while (heap_len >= 2);

    heap[--heap_max] = heap[SMALLEST];

    /* At this point, the fields freq and dad are set. We can now
     * generate the bit lengths.
     */
    gen_bitlen((tree_desc near *)desc);

    /* The field len is now set, we can generate the bit codes */
    gen_codes ((ct_data near *)tree, max_code);
}